

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall cmListFileBacktrace::PrintTitle(cmListFileBacktrace *this,ostream *out)

{
  bool bVar1;
  ostream *os;
  char *local_118;
  string local_f0;
  string local_c0;
  undefined1 local_a0 [8];
  cmListFileContext lfc;
  undefined1 local_38 [8];
  cmOutputConverter converter;
  ostream *out_local;
  cmListFileBacktrace *this_local;
  
  converter._24_8_ = out;
  bVar1 = cmState::Snapshot::IsValid(&this->Snapshot);
  if (bVar1) {
    lfc.Line = (long)(this->Snapshot).State;
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_38,this->Snapshot);
    cmState::Snapshot::GetExecutionListFile_abi_cxx11_(&local_c0,&this->Snapshot);
    cmListFileContext::FromCommandContext((cmListFileContext *)local_a0,&this->Context,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    cmOutputConverter::Convert
              (&local_f0,(cmOutputConverter *)local_38,(string *)((long)&lfc.Name.field_2 + 8),HOME,
               UNCHANGED);
    std::__cxx11::string::operator=
              ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    if (lfc.FilePath.field_2._8_8_ == 0) {
      local_118 = " in ";
    }
    else {
      local_118 = " at ";
    }
    os = std::operator<<((ostream *)converter._24_8_,local_118);
    ::operator<<(os,(cmListFileContext *)local_a0);
    cmListFileContext::~cmListFileContext((cmListFileContext *)local_a0);
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintTitle(std::ostream& out) const
{
  if (!this->Snapshot.IsValid())
    {
    return;
    }
  cmOutputConverter converter(this->Snapshot);
  cmListFileContext lfc =
      cmListFileContext::FromCommandContext(
        this->Context, this->Snapshot.GetExecutionListFile());
  lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);
  out << (lfc.Line ? " at " : " in ") << lfc;
}